

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::numeric::numeric<std::fpos<__mbstate_t>>(numeric *this,fpos<__mbstate_t> *dat)

{
  streamoff sVar1;
  fpos *in_RSI;
  longdouble *in_RDI;
  
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)(in_RDI + 1) = 0;
  sVar1 = std::fpos::operator_cast_to_long(in_RSI);
  *in_RDI = (longdouble)sVar1;
  return;
}

Assistant:

numeric(const T &dat)
		{
			if (std::is_integral<T>::value) {
				type = 1;
				data._int = dat;
			}
			else {
				type = 0;
				data._num = dat;
			}
		}